

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitStringTest_random_vector_Test<wchar_t>::TestBody
          (SplitStringTest_random_vector_Test<wchar_t> *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b0 [8];
  Message local_a8 [8];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  undefined1 local_80 [8];
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  split_result;
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> data;
  SplitStringTest_random_vector_Test<wchar_t> *this_local;
  
  data.m_tokens.
  super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::RandomTestData
            ((RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
             &split_result.
              super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,L'\0',0,0);
  jessilib::
  split<std::vector,_std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>
            ((container_type_conflict9 *)local_80,
             (vector<wchar_t,_std::allocator<wchar_t>_> *)&data.m_fixed_word_length,0);
  testing::internal::EqHelper::
  Compare<std::vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>,_std::vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>,_nullptr>
            ((EqHelper *)local_a0,"split_result","data.m_tokens",
             (vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
              *)local_80,
             (vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
              *)&data.m_str.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.field_0x10
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=(local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::
  vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
             *)local_80);
  RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_>::~RandomTestData
            ((RandomTestData<wchar_t,_std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
             &split_result.
              super__Vector_base<std::vector<wchar_t,_std::allocator<wchar_t>_>,_std::allocator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, random_vector) {
	RandomTestData<TypeParam, std::vector<TypeParam>> data{};
	std::vector<std::vector<TypeParam>> split_result = split<std::vector, std::vector<TypeParam>>(data.m_str, default_delim<TypeParam>);
	EXPECT_EQ(split_result, data.m_tokens);
}